

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralAttributeCheck.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::GeneralAttributeCheck::checkAttributes
          (GeneralAttributeCheck *this,DOMElement *elem,unsigned_short elemContext,
          TraverseSchema *schema,bool isTopLevel,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  unsigned_short *puVar7;
  uint local_bc;
  uint j;
  OutOfMemoryException *anon_var_0;
  bool bContinue;
  int attNameId;
  XMLCh *attrURI;
  XMLCh *attName;
  DOMNode *attribute;
  XMLSize_t i;
  XMLByte attList [34];
  XMLSize_t attrCount;
  DOMNamedNodeMap *eltAttrs;
  XMLCh *elemName;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList_local;
  bool isTopLevel_local;
  TraverseSchema *schema_local;
  unsigned_short elemContext_local;
  DOMElement *elem_local;
  GeneralAttributeCheck *this_local;
  XMLCh *text1;
  undefined4 extraout_var_01;
  
  if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
    ValueVectorOf<xercesc_4_0::DOMNode_*>::removeAllElements(nonXSAttList);
  }
  if (((elem != (DOMElement *)0x0) &&
      (fAttMap != (ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher> *)0x0)) &&
     (elemContext < 0x32)) {
    iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0x18])();
    text1 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0x16])();
    bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                              (XMLCh *)CONCAT44(extraout_var_00,iVar2));
    if (!bVar1) {
      TraverseSchema::reportSchemaError
                (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x94,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0xb])();
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar2);
    register0x00000000 = (DOMNode *)(**(code **)(*plVar4 + 0x28))();
    memset(&i,0,0x22);
    for (attribute = (DOMNode *)0x0; attribute < stack0xffffffffffffffb0;
        attribute = (DOMNode *)((long)&attribute->_vptr_DOMNode + 1)) {
      attName = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4,attribute);
      pXVar5 = (XMLCh *)(**(code **)(*(long *)attName + 0x10))();
      bVar1 = XMLString::equals(pXVar5,(XMLCh *)XMLUni::fgXMLNSString);
      if ((!bVar1) &&
         (bVar1 = XMLString::startsWith(pXVar5,(XMLCh *)XMLUni::fgXMLNSColonString), !bVar1)) {
        if ((((*pXVar5 == L'X') || (*pXVar5 == L'x')) &&
            ((pXVar5[1] == L'M' || (pXVar5[1] == L'm')))) &&
           ((pXVar5[2] == L'L' || (pXVar5[2] == L'l')))) {
          if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
            ValueVectorOf<xercesc_4_0::DOMNode_*>::addElement(nonXSAttList,(DOMNode **)&attName);
          }
        }
        else {
          pXVar6 = (XMLCh *)(**(code **)(*(long *)attName + 0xb0))();
          if ((pXVar6 == (XMLCh *)0x0) || (*pXVar6 == L'\0')) {
            pXVar5 = (XMLCh *)(**(code **)(*(long *)attName + 0xc0))();
            puVar7 = ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher>::get
                               (fAttMap,pXVar5,this->fMemoryManager);
            uVar3 = (uint)*puVar7;
            if ((*(ushort *)(fgElemAttTable + (long)(int)uVar3 * 2 + (ulong)elemContext * 0x44) & 3)
                == 0) {
              iVar2 = 0x52;
              if (isTopLevel) {
                iVar2 = 0x51;
              }
              TraverseSchema::reportSchemaError
                        (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar2,pXVar5,text1,(XMLCh *)0x0
                         ,(XMLCh *)0x0);
            }
            else {
              attList[(long)(int)uVar3 + -8] = '\x01';
              pXVar6 = (XMLCh *)(**(code **)(*(long *)attName + 0x18))();
              validate(this,elem,pXVar5,pXVar6,
                       *(ushort *)
                        (fgElemAttTable + (long)(int)uVar3 * 2 + (ulong)elemContext * 0x44) & 0x1ffc
                       ,schema);
            }
          }
          else {
            bVar1 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            if (((bVar1) ||
                (bVar1 = XMLString::equals(text1,(XMLCh *)SchemaSymbols::fgELT_APPINFO), bVar1)) ||
               (bVar1 = XMLString::equals(text1,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION), bVar1)
               ) {
              iVar2 = 0x52;
              if (isTopLevel) {
                iVar2 = 0x51;
              }
              TraverseSchema::reportSchemaError
                        (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar2,pXVar5,text1,(XMLCh *)0x0
                         ,(XMLCh *)0x0);
            }
            else if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
              ValueVectorOf<xercesc_4_0::DOMNode_*>::addElement(nonXSAttList,(DOMNode **)&attName);
            }
          }
        }
      }
    }
    for (local_bc = 0; local_bc < 0x22; local_bc = local_bc + 1) {
      if (((*(ushort *)(fgElemAttTable + (ulong)local_bc * 2 + (ulong)elemContext * 0x44) & 1) != 0)
         && (attList[(ulong)local_bc - 8] == '\0')) {
        iVar2 = 0x50;
        if (isTopLevel) {
          iVar2 = 0x4f;
        }
        TraverseSchema::reportSchemaError
                  (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar2,
                   *(XMLCh **)(fAttNames + (ulong)local_bc * 8),text1,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
GeneralAttributeCheck::checkAttributes(const DOMElement* const elem,
                                       const unsigned short elemContext,
                                       TraverseSchema* const schema,
                                       const bool isTopLevel,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList)
{
    if (nonXSAttList)
        nonXSAttList->removeAllElements();

    if (elem == 0 || !fAttMap || elemContext>=E_Count)
        return;

    const XMLCh* elemName = elem->getLocalName();
    if (!XMLString::equals(SchemaSymbols::fgURI_SCHEMAFORSCHEMA, elem->getNamespaceURI())) {
        schema->reportSchemaError
        (
            elem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::ELTSchemaNS
            , elemName
        );
    }

    DOMNamedNodeMap* eltAttrs = elem->getAttributes();
    const XMLSize_t  attrCount = eltAttrs->getLength();
    XMLByte          attList[A_Count];

    memset(attList, 0, sizeof(attList));

    for (XMLSize_t i = 0; i < attrCount; i++) {

        DOMNode*     attribute = eltAttrs->item(i);
        const XMLCh* attName = attribute->getNodeName();

        // skip namespace declarations
        if (XMLString::equals(attName, XMLUni::fgXMLNSString)
            || XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            continue;

        // Bypass attributes that start with xml
        // add this to the list of "non-schema" attributes
        if ((*attName == chLatin_X || *attName == chLatin_x)
           && (*(attName+1) == chLatin_M || *(attName+1) == chLatin_m)
           && (*(attName+2) == chLatin_L || *(attName+2) == chLatin_l)) {

           if (nonXSAttList)
                nonXSAttList->addElement(attribute);

            continue;
        }

        // for attributes with namespace prefix
        const XMLCh* attrURI = attribute->getNamespaceURI();

        if (attrURI != 0 && *attrURI) {

            // attributes with schema namespace are not allowed
            // and not allowed on "documentation" and "appInfo"
            if (XMLString::equals(attrURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_APPINFO) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_DOCUMENTATION)) {

                schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                          isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                          attName, elemName);
            }
            else if (nonXSAttList)
            {
                nonXSAttList->addElement(attribute);
            }

            continue;
        }

        int attNameId = A_Invalid;
        attName = attribute->getLocalName();

        bool bContinue=false;   // workaround for Borland bug with 'continue' in 'catch'
        try {
            attNameId= fAttMap->get(attName, fMemoryManager);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {

            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
            bContinue=true;
        }
        if(bContinue)
            continue;

        if (fgElemAttTable[elemContext][attNameId] & Att_Mask) {

            attList[attNameId] = 1;
            validate
            (
                elem
                , attName
                , attribute->getNodeValue()
                , fgElemAttTable[elemContext][attNameId] & DV_Mask
                , schema
            );
        }
        else {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
        }
    }

    // ------------------------------------------------------------------
    // Check for required attributes
    // ------------------------------------------------------------------
    for (unsigned int j=0; j < A_Count; j++) {

        if ((fgElemAttTable[elemContext][j] & Att_Required) && attList[j] == 0) {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain, 
                                      isTopLevel?XMLErrs::AttributeRequiredGlobal:XMLErrs::AttributeRequiredLocal, 
                                      fAttNames[j], elemName);
        }
    }
}